

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

t_int * min_perf8(t_int *w)

{
  float fVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  tVar2 = w[4];
  if ((int)tVar2 != 0) {
    lVar3 = w[3];
    lVar4 = w[1];
    lVar5 = w[2];
    lVar6 = 0;
    do {
      fVar7 = *(float *)(lVar4 + lVar6 * 4);
      fVar8 = *(float *)(lVar4 + 4 + lVar6 * 4);
      fVar9 = *(float *)(lVar4 + 8 + lVar6 * 4);
      fVar10 = *(float *)(lVar4 + 0xc + lVar6 * 4);
      fVar11 = *(float *)(lVar4 + 0x10 + lVar6 * 4);
      fVar12 = *(float *)(lVar4 + 0x14 + lVar6 * 4);
      fVar13 = *(float *)(lVar4 + 0x18 + lVar6 * 4);
      fVar14 = *(float *)(lVar4 + 0x1c + lVar6 * 4);
      fVar1 = *(float *)(lVar5 + lVar6 * 4);
      if (fVar1 <= fVar7) {
        fVar7 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 4 + lVar6 * 4);
      if (fVar1 <= fVar8) {
        fVar8 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 8 + lVar6 * 4);
      if (fVar1 <= fVar9) {
        fVar9 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 0xc + lVar6 * 4);
      if (fVar1 <= fVar10) {
        fVar10 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 0x10 + lVar6 * 4);
      if (fVar1 <= fVar11) {
        fVar11 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 0x14 + lVar6 * 4);
      if (fVar1 <= fVar12) {
        fVar12 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 0x18 + lVar6 * 4);
      if (fVar1 <= fVar13) {
        fVar13 = fVar1;
      }
      fVar1 = *(float *)(lVar5 + 0x1c + lVar6 * 4);
      if (fVar1 <= fVar14) {
        fVar14 = fVar1;
      }
      *(float *)(lVar3 + lVar6 * 4) = fVar7;
      *(float *)(lVar3 + 4 + lVar6 * 4) = fVar8;
      *(float *)(lVar3 + 8 + lVar6 * 4) = fVar9;
      *(float *)(lVar3 + 0xc + lVar6 * 4) = fVar10;
      *(float *)(lVar3 + 0x10 + lVar6 * 4) = fVar11;
      *(float *)(lVar3 + 0x14 + lVar6 * 4) = fVar12;
      *(float *)(lVar3 + 0x18 + lVar6 * 4) = fVar13;
      *(float *)(lVar3 + 0x1c + lVar6 * 4) = fVar14;
      lVar6 = lVar6 + 8;
    } while ((int)tVar2 != (int)lVar6);
  }
  return w + 5;
}

Assistant:

t_int *min_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = (f0 < g0 ? f0 : g0); out[1] = (f1 < g1 ? f1 : g1);
        out[2] = (f2 < g2 ? f2 : g2); out[3] = (f3 < g3 ? f3 : g3);
        out[4] = (f4 < g4 ? f4 : g4); out[5] = (f5 < g5 ? f5 : g5);
        out[6] = (f6 < g6 ? f6 : g6); out[7] = (f7 < g7 ? f7 : g7);
    }
    return (w+5);
}